

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip39.c
# Opt level: O1

int bip39_get_word(words *w,size_t idx,char **output)

{
  words *w_00;
  char *pcVar1;
  int iVar2;
  
  iVar2 = -2;
  if (output != (char **)0x0) {
    *output = (char *)0x0;
    w_00 = &en_words;
    if (w != (words *)0x0) {
      w_00 = w;
    }
    pcVar1 = wordlist_lookup_index(w_00,idx);
    if (pcVar1 != (char *)0x0) {
      pcVar1 = wally_strdup(pcVar1);
      *output = pcVar1;
      iVar2 = (uint)(pcVar1 != (char *)0x0) * 3 + -3;
    }
  }
  return iVar2;
}

Assistant:

int bip39_get_word(const struct words *w, size_t idx,
                   char **output)
{
    const char *word;

    if (output)
        *output = NULL;

    w = w ? w : &en_words;

    if (!output || !(word = wordlist_lookup_index(w, idx)))
        return WALLY_EINVAL;

    *output = wally_strdup(word);
    return *output ? WALLY_OK : WALLY_ENOMEM;
}